

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O1

void anon_unknown.dwarf_2a21b2d::PrepBuffers<unsigned_short>
               (ACMRandom *rnd,int w,int h,int stride,int bd,bool trash_edges,unsigned_short *data)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  uint32_t uVar4;
  unsigned_short *puVar5;
  ulong uVar6;
  int i;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  unsigned_short *puVar11;
  unsigned_short *puVar12;
  
  FillEdge<unsigned_short>(rnd,stride << 5,bd,trash_edges,data);
  if (0 < h) {
    uVar3 = ~(ushort)(-1 << ((byte)bd & 0x1f));
    lVar10 = (long)stride;
    puVar12 = data + lVar10 * 0x20;
    puVar11 = data + (long)w + lVar10 * 0x20 + 0x20;
    uVar6 = 0;
    do {
      puVar2 = data + (uVar6 + 0x20) * lVar10;
      if (trash_edges) {
        lVar8 = 0;
        do {
          uVar4 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar12[lVar8] = (ushort)(uVar4 >> 0xf) & uVar3;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x20);
      }
      else {
        puVar2[0x18] = 0;
        puVar2[0x19] = 0;
        puVar2[0x1a] = 0;
        puVar2[0x1b] = 0;
        puVar2[0x1c] = 0;
        puVar2[0x1d] = 0;
        puVar2[0x1e] = 0;
        puVar2[0x1f] = 0;
        puVar2[0x10] = 0;
        puVar2[0x11] = 0;
        puVar2[0x12] = 0;
        puVar2[0x13] = 0;
        puVar2[0x14] = 0;
        puVar2[0x15] = 0;
        puVar2[0x16] = 0;
        puVar2[0x17] = 0;
        puVar2[8] = 0;
        puVar2[9] = 0;
        puVar2[10] = 0;
        puVar2[0xb] = 0;
        puVar2[0xc] = 0;
        puVar2[0xd] = 0;
        puVar2[0xe] = 0;
        puVar2[0xf] = 0;
        puVar2[0] = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
        puVar2[3] = 0;
        puVar2[4] = 0;
        puVar2[5] = 0;
        puVar2[6] = 0;
        puVar2[7] = 0;
      }
      if (0 < w) {
        uVar9 = 0;
        do {
          uVar4 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar12[uVar9 + 0x20] = (ushort)(uVar4 >> 0xf) & uVar3;
          uVar9 = uVar9 + 1;
        } while ((uint)w != uVar9);
      }
      if (trash_edges) {
        lVar8 = 0;
        do {
          uVar4 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar11[lVar8] = (ushort)(uVar4 >> 0xf) & uVar3;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x20);
      }
      else {
        puVar5 = puVar2 + (long)w + 0x20;
        puVar1 = puVar2 + (long)w + 0x38;
        puVar1[0] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1 = puVar2 + (long)w + 0x3c;
        puVar1[0] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1 = puVar2 + (long)w + 0x30;
        puVar1[0] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1 = puVar2 + (long)w + 0x34;
        puVar1[0] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1 = puVar2 + (long)w + 0x28;
        puVar1[0] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1 = puVar2 + (long)w + 0x2c;
        puVar1[0] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar5[0] = 0;
        puVar5[1] = 0;
        puVar5[2] = 0;
        puVar5[3] = 0;
        puVar2 = puVar2 + (long)w + 0x24;
        puVar2[0] = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
        puVar2[3] = 0;
      }
      uVar6 = uVar6 + 1;
      puVar12 = puVar12 + lVar10;
      puVar11 = puVar11 + lVar10;
    } while (uVar6 != (uint)h);
  }
  FillEdge<unsigned_short>(rnd,stride << 5,bd,trash_edges,data + (h + 0x20) * stride);
  iVar7 = (h + 0x40) * stride;
  memcpy(data + iVar7,data,(long)(iVar7 * 2));
  return;
}

Assistant:

void PrepBuffers(ACMRandom *rnd, int w, int h, int stride, int bd,
                 bool trash_edges, Pixel *data) {
  assert(rnd);
  const Pixel mask = (1 << bd) - 1;

  // Fill in the first buffer with random data
  // Top border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data);
  for (int r = 0; r < h; ++r) {
    Pixel *row_data = data + (kVPad + r) * stride;
    // Left border, contents, right border
    FillEdge(rnd, kHPad, bd, trash_edges, row_data);
    for (int c = 0; c < w; ++c) row_data[kHPad + c] = rnd->Rand16() & mask;
    FillEdge(rnd, kHPad, bd, trash_edges, row_data + kHPad + w);
  }
  // Bottom border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data + stride * (kVPad + h));

  const int bpp = sizeof(*data);
  const int block_elts = stride * (h + 2 * kVPad);
  const int block_size = bpp * block_elts;

  // Now copy that to the second buffer
  memcpy(data + block_elts, data, block_size);
}